

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
  *this_00;
  aom_rc_mode *in_RDI;
  anon_struct_12_3_f749cb25_for__M_head_impl *unaff_retaddr;
  CodecFactory **in_stack_00000008;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_stack_00000010;
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
  *in_stack_ffffffffffffffc8;
  
  bVar1 = AtEnd(in_stack_00000010);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x4be1be);
    this_00 = (shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
               *)ParamIterator<const_libaom_test::CodecFactory_*>::operator*
                           ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x4be1c6);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x4be1d9);
    ParamIterator<(anonymous_namespace)::gfIntervalParam>::operator*
              ((ParamIterator<(anonymous_namespace)::gfIntervalParam> *)0x4be1e1);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x4be1f4);
    ParamIterator<aom_rc_mode>::operator*((ParamIterator<aom_rc_mode> *)0x4be1fc);
    std::
    make_shared<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::gfIntervalParam,aom_rc_mode>,libaom_test::CodecFactory_const*const&,(anonymous_namespace)::gfIntervalParam_const&,aom_rc_mode_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
    ::operator=(this_00,in_stack_ffffffffffffffc8);
    std::
    shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
    ::~shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>
                   *)0x4be230);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }